

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finitediff.cpp
# Opt level: O0

MatrixXd *
fd::unflatten(MatrixXd *__return_storage_ptr__,
             Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *x,int dim
             )

{
  Index IVar1;
  Scalar *pSVar2;
  CoeffReturnType CVar3;
  int local_2c;
  long lStack_28;
  int i;
  undefined1 local_1d;
  int local_1c;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *pRStack_18;
  int dim_local;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *x_local;
  MatrixXd *X;
  
  local_1d = 0;
  local_1c = dim;
  pRStack_18 = x;
  x_local = (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
            __return_storage_ptr__;
  IVar1 = Eigen::
          EigenBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ::size((EigenBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  *)x);
  lStack_28 = IVar1 / (long)local_1c;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&stack0xffffffffffffffd8,
             &local_1c);
  for (local_2c = 0;
      IVar1 = Eigen::
              EigenBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ::size((EigenBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      *)pRStack_18), local_2c < IVar1; local_2c = local_2c + 1) {
    CVar3 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)pRStack_18,(long)local_2c);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,(long)(local_2c / local_1c),
                        (long)(local_2c % local_1c));
    *pSVar2 = CVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd unflatten(const Eigen::Ref<const Eigen::VectorXd>& x, int dim)
{
    assert(x.size() % dim == 0);
    Eigen::MatrixXd X(x.size() / dim, dim);
    for (int i = 0; i < x.size(); i++) {
        X(i / dim, i % dim) = x(i);
    }
    return X;
}